

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O3

ssize_t archive_write_zip_data(archive_write *a,void *buff,size_t s)

{
  uint8_t *puVar1;
  size_t nbytes;
  byte bVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  undefined4 uVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  uint8_t *in;
  uint i;
  size_t sVar10;
  long lVar11;
  size_t key_len;
  ulong uVar12;
  uint8_t salt [18];
  uint8_t key [12];
  byte local_98 [24];
  archive_hmac_sha1_ctx *local_80;
  undefined8 local_78;
  undefined1 local_6d;
  uint8_t auStack_68 [56];
  
  pvVar3 = a->format_data;
  if ((long)*(ulong *)((long)pvVar3 + 0x28) < (long)s) {
    s = *(ulong *)((long)pvVar3 + 0x28);
  }
  *(long *)((long)pvVar3 + 0x20) = *(long *)((long)pvVar3 + 0x20) + s;
  if (s == 0) {
    return 0;
  }
  if ((*(byte *)((long)pvVar3 + 0x44) & 1) == 0) {
LAB_0017d76d:
    if (*(int *)((long)pvVar3 + 0x3c) == 8) {
      *(void **)((long)pvVar3 + 0x140) = buff;
      *(int *)((long)pvVar3 + 0x148) = (int)s;
      do {
        iVar7 = cm_zlib_deflate((z_streamp)((long)pvVar3 + 0x140),0);
        if (iVar7 == -2) {
          return -0x1e;
        }
        if (*(int *)((long)pvVar3 + 0x160) == 0) {
          if (*(char *)((long)pvVar3 + 0x5c) == '\0') {
            if (*(char *)((long)pvVar3 + 0xc0) != '\0') {
              local_78 = *(size_t *)((long)pvVar3 + 0x1b0);
              iVar7 = aes_ctr_update((archive_crypto_ctx *)((long)pvVar3 + 0x68),
                                     *(uint8_t **)((long)pvVar3 + 0x1b8),local_78,
                                     *(uint8_t **)((long)pvVar3 + 0x1b8),&local_78);
              if (iVar7 < 0) goto LAB_0017daaf;
              __hmac_sha1_update((archive_hmac_sha1_ctx *)((long)pvVar3 + 200),
                                 *(uint8_t **)((long)pvVar3 + 0x1b8),
                                 *(size_t *)((long)pvVar3 + 0x1b0));
            }
          }
          else {
            trad_enc_encrypt_update
                      ((trad_enc_ctx *)((long)pvVar3 + 0x50),*(uint8_t **)((long)pvVar3 + 0x1b8),
                       *(size_t *)((long)pvVar3 + 0x1b0),*(uint8_t **)((long)pvVar3 + 0x1b8),
                       *(size_t *)((long)pvVar3 + 0x1b0));
          }
          iVar7 = __archive_write_output
                            (a,*(void **)((long)pvVar3 + 0x1b8),*(size_t *)((long)pvVar3 + 0x1b0));
          if (iVar7 != 0) goto LAB_0017dc29;
          lVar11 = *(long *)((long)pvVar3 + 0x1b0);
          *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + lVar11;
          *(long *)((long)pvVar3 + 0x110) = *(long *)((long)pvVar3 + 0x110) + lVar11;
          *(undefined8 *)((long)pvVar3 + 0x158) = *(undefined8 *)((long)pvVar3 + 0x1b8);
          *(int *)((long)pvVar3 + 0x160) = (int)lVar11;
        }
      } while (*(int *)((long)pvVar3 + 0x148) != 0);
    }
    else {
      if (*(int *)((long)pvVar3 + 0x3c) != 0) {
        archive_set_error(&a->archive,-1,"Invalid ZIP compression type");
        return -0x1e;
      }
      if ((*(char *)((long)pvVar3 + 0x5c) == '\0') && (*(char *)((long)pvVar3 + 0xc0) == '\0')) {
        iVar7 = __archive_write_output(a,buff,s);
        if (iVar7 != 0) goto LAB_0017dc29;
        *(long *)((long)pvVar3 + 0x110) = *(long *)((long)pvVar3 + 0x110) + s;
        *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + s;
      }
      else if (0 < (long)s) {
        puVar1 = (uint8_t *)(s + (long)buff);
        local_80 = (archive_hmac_sha1_ctx *)((long)pvVar3 + 200);
        in = (uint8_t *)buff;
        do {
          if (*(char *)((long)pvVar3 + 0x5c) == '\0') {
            local_78 = *(size_t *)((long)pvVar3 + 0x1b0);
            iVar7 = aes_ctr_update((archive_crypto_ctx *)((long)pvVar3 + 0x68),in,
                                   (long)puVar1 - (long)in,*(uint8_t **)((long)pvVar3 + 0x1b8),
                                   &local_78);
            if (iVar7 < 0) {
LAB_0017daaf:
              archive_set_error(&a->archive,-1,"Failed to encrypt file");
              return -0x19;
            }
            __hmac_sha1_update(local_80,*(uint8_t **)((long)pvVar3 + 0x1b8),local_78);
          }
          else {
            uVar5 = trad_enc_encrypt_update
                              ((trad_enc_ctx *)((long)pvVar3 + 0x50),in,(long)puVar1 - (long)in,
                               *(uint8_t **)((long)pvVar3 + 0x1b8),*(size_t *)((long)pvVar3 + 0x1b0)
                              );
            local_78 = (size_t)uVar5;
          }
          iVar7 = __archive_write_output(a,*(void **)((long)pvVar3 + 0x1b8),local_78);
          if (iVar7 != 0) goto LAB_0017dc29;
          *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + local_78;
          *(long *)((long)pvVar3 + 0x110) = *(long *)((long)pvVar3 + 0x110) + local_78;
          in = in + local_78;
        } while (in < puVar1);
      }
    }
    *(long *)((long)pvVar3 + 0x28) = *(long *)((long)pvVar3 + 0x28) - s;
    if ((*(char *)((long)pvVar3 + 0xc0) == '\0') || (*(int *)((long)pvVar3 + 0x60) != 2)) {
      uVar6 = (**(code **)((long)pvVar3 + 0xe8))
                        (*(undefined4 *)((long)pvVar3 + 0x38),buff,s & 0xffffffff);
      *(undefined4 *)((long)pvVar3 + 0x38) = uVar6;
    }
  }
  else {
    if (1 < *(int *)((long)pvVar3 + 0x40) - 2U) {
      if ((*(int *)((long)pvVar3 + 0x40) == 1) && (*(char *)((long)pvVar3 + 0x5c) == '\0')) {
        pcVar8 = __archive_write_get_passphrase(a);
        if (pcVar8 == (char *)0x0) goto LAB_0017da69;
        iVar7 = archive_random(&local_78,0xb);
        if (iVar7 != 0) goto LAB_0017da49;
        sVar9 = strlen(pcVar8);
        *(undefined8 *)((long)pvVar3 + 0x50) = 0x2345678912345678;
        *(undefined4 *)((long)pvVar3 + 0x58) = 0x34567890;
        if (sVar9 != 0) {
          sVar10 = 0;
          do {
            trad_enc_update_keys((trad_enc_ctx *)((long)pvVar3 + 0x50),pcVar8[sVar10]);
            sVar10 = sVar10 + 1;
          } while (sVar9 != sVar10);
        }
        local_6d = *(undefined1 *)((long)pvVar3 + 0x5d);
        lVar11 = 0;
        do {
          uVar5 = *(uint *)((long)pvVar3 + 0x58) | 2;
          local_98[lVar11] = (byte)((uVar5 ^ 1) * uVar5 >> 8) ^ *(byte *)((long)&local_78 + lVar11);
          trad_enc_update_keys
                    ((trad_enc_ctx *)((long)pvVar3 + 0x50),*(byte *)((long)&local_78 + lVar11));
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0xc);
        iVar7 = __archive_write_output(a,local_98,0xc);
        if (iVar7 != 0) goto LAB_0017dc29;
        *(long *)((long)pvVar3 + 0x110) = *(long *)((long)pvVar3 + 0x110) + 0xc;
        *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + 0xc;
        *(undefined1 *)((long)pvVar3 + 0x5c) = 1;
      }
      goto LAB_0017d76d;
    }
    if (*(char *)((long)pvVar3 + 0xc0) != '\0') goto LAB_0017d76d;
    pcVar8 = __archive_write_get_passphrase(a);
    if (pcVar8 == (char *)0x0) {
LAB_0017da69:
      pcVar8 = "Encryption needs passphrase";
LAB_0017da70:
      archive_set_error(&a->archive,-1,pcVar8);
      iVar7 = -0x19;
    }
    else {
      iVar7 = *(int *)((long)pvVar3 + 0x40);
      lVar11 = (ulong)(iVar7 != 2) * 8;
      nbytes = lVar11 + 8;
      iVar4 = archive_random(local_98,nbytes);
      if (iVar4 == 0) {
        key_len = (ulong)(iVar7 != 2) * 0x10 + 0x10;
        sVar9 = strlen(pcVar8);
        uVar12 = (ulong)(uint)((int)key_len * 2);
        pbkdf2_sha1(pcVar8,sVar9,local_98,nbytes,1000,(uint8_t *)&local_78,uVar12 | 2);
        iVar4 = aes_ctr_init((archive_crypto_ctx *)((long)pvVar3 + 0x68),(uint8_t *)&local_78,
                             key_len);
        if (iVar4 == 0) {
          iVar4 = __hmac_sha1_init((archive_hmac_sha1_ctx *)((long)pvVar3 + 200),
                                   auStack_68 + (ulong)(iVar7 != 2) * 0x10,key_len);
          if (iVar4 == 0) {
            bVar2 = *(byte *)((long)&local_78 + uVar12 + 1);
            local_98[(ulong)(iVar7 != 2) * 8 + 8] = *(byte *)((long)&local_78 + uVar12);
            local_98[lVar11 + 9] = bVar2;
            uVar12 = nbytes | 2;
            iVar7 = __archive_write_output(a,local_98,uVar12);
            if (iVar7 != 0) goto LAB_0017dc29;
            *(long *)((long)pvVar3 + 0x110) = *(long *)((long)pvVar3 + 0x110) + uVar12;
            *(long *)((long)pvVar3 + 0x18) = *(long *)((long)pvVar3 + 0x18) + uVar12;
            *(undefined1 *)((long)pvVar3 + 0xd0) = 1;
            *(undefined1 *)((long)pvVar3 + 0xc0) = 1;
            goto LAB_0017d76d;
          }
          aes_ctr_release((archive_crypto_ctx *)((long)pvVar3 + 0x68));
          pcVar8 = "Failed to initialize HMAC-SHA1";
        }
        else {
          pcVar8 = "Decryption is unsupported due to lack of crypto library";
        }
        goto LAB_0017da70;
      }
LAB_0017da49:
      archive_set_error(&a->archive,-1,"Can\'t generate random number for encryption");
      iVar7 = -0x1e;
    }
LAB_0017dc29:
    s = (size_t)iVar7;
  }
  return s;
}

Assistant:

static ssize_t
archive_write_zip_data(struct archive_write *a, const void *buff, size_t s)
{
	int ret;
	struct zip *zip = a->format_data;

	if ((int64_t)s > zip->entry_uncompressed_limit)
		s = (size_t)zip->entry_uncompressed_limit;
	zip->entry_uncompressed_written += s;

	if (s == 0) return 0;

	if (zip->entry_flags & ZIP_ENTRY_FLAG_ENCRYPTED) {
		switch (zip->entry_encryption) {
		case ENCRYPTION_TRADITIONAL:
			/* Initialize traditional PKWARE encryption context. */
			if (!zip->tctx_valid) {
				ret = init_traditional_pkware_encryption(a);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->tctx_valid = 1;
			}
			break;
		case ENCRYPTION_WINZIP_AES128:
		case ENCRYPTION_WINZIP_AES256:
			if (!zip->cctx_valid) {
				ret = init_winzip_aes_encryption(a);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->cctx_valid = zip->hctx_valid = 1;
			}
			break;
		case ENCRYPTION_NONE:
		default:
			break;
		}
	}

	switch (zip->entry_compression) {
	case COMPRESSION_STORE:
		if (zip->tctx_valid || zip->cctx_valid) {
			const uint8_t *rb = (const uint8_t *)buff;
			const uint8_t * const re = rb + s;

			while (rb < re) {
				size_t l;

				if (zip->tctx_valid) {
					l = trad_enc_encrypt_update(&zip->tctx,
					    rb, re - rb,
					    zip->buf, zip->len_buf);
				} else {
					l = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
					    &zip->cctx,
					    rb, re - rb, zip->buf, &l);
					if (ret < 0) {
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_MISC,
						    "Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
					    zip->buf, l);
				}
				ret = __archive_write_output(a, zip->buf, l);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += l;
				zip->written_bytes += l;
				rb += l;
			}
		} else {
			ret = __archive_write_output(a, buff, s);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->written_bytes += s;
			zip->entry_compressed_written += s;
		}
		break;
#if HAVE_ZLIB_H
	case COMPRESSION_DEFLATE:
		zip->stream.next_in = (unsigned char*)(uintptr_t)buff;
		zip->stream.avail_in = (uInt)s;
		do {
			ret = deflate(&zip->stream, Z_NO_FLUSH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			if (zip->stream.avail_out == 0) {
				if (zip->tctx_valid) {
					trad_enc_encrypt_update(&zip->tctx,
					    zip->buf, zip->len_buf,
					    zip->buf, zip->len_buf);
				} else if (zip->cctx_valid) {
					size_t outl = zip->len_buf;
					ret = archive_encrypto_aes_ctr_update(
					    &zip->cctx,
					    zip->buf, zip->len_buf,
					    zip->buf, &outl);
					if (ret < 0) {
						archive_set_error(&a->archive,
						    ARCHIVE_ERRNO_MISC,
						    "Failed to encrypt file");
						return (ARCHIVE_FAILED);
					}
					archive_hmac_sha1_update(&zip->hctx,
					    zip->buf, zip->len_buf);
				}
				ret = __archive_write_output(a, zip->buf,
					zip->len_buf);
				if (ret != ARCHIVE_OK)
					return (ret);
				zip->entry_compressed_written += zip->len_buf;
				zip->written_bytes += zip->len_buf;
				zip->stream.next_out = zip->buf;
				zip->stream.avail_out = (uInt)zip->len_buf;
			}
		} while (zip->stream.avail_in != 0);
		break;
#endif

	case COMPRESSION_UNSPECIFIED:
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Invalid ZIP compression type");
		return ARCHIVE_FATAL;
	}

	zip->entry_uncompressed_limit -= s;
	if (!zip->cctx_valid || zip->aes_vendor != AES_VENDOR_AE_2)
		zip->entry_crc32 =
		    zip->crc32func(zip->entry_crc32, buff, (unsigned)s);
	return (s);

}